

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_list.c
# Opt level: O1

void insertElement(VM *vm,ObjList *objList,uint32_t index,Value value)

{
  ValueBuffer *buf;
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint32_t uVar3;
  Value *pVVar4;
  undefined8 uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  buf = &objList->elements;
  if ((objList->elements).count - 1 < index) {
    errorReport((void *)0x0,ERROR_RUNTIME,"index out bounded!");
  }
  ValueBufferAdd(vm,buf,(Value)ZEXT816(1));
  uVar3 = (objList->elements).count;
  uVar7 = uVar3 - 1;
  if (index < uVar7) {
    lVar6 = (ulong)(uVar3 - 2) << 4;
    lVar8 = (ulong)uVar7 << 4;
    do {
      puVar1 = (undefined8 *)((long)&buf->datas->type + lVar6);
      uVar5 = puVar1[1];
      puVar2 = (undefined8 *)((long)&buf->datas->type + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
      lVar6 = lVar6 + -0x10;
      lVar8 = lVar8 + -0x10;
      uVar7 = uVar7 - 1;
    } while (index < uVar7);
  }
  pVVar4 = buf->datas;
  pVVar4[index].type = value.type;
  pVVar4[index].field_1 = value.field_1;
  return;
}

Assistant:

void insertElement(VM *vm, ObjList *objList, uint32_t index, Value value) {
    if (index > objList->elements.count - 1) {
        RUN_ERROR("index out bounded!");
    }

    // 增加一个空位
    ValueBufferAdd(vm, &objList->elements, VT_TO_VALUE(VT_NULL));

    // index后面的元素整体后移一位
    uint32_t idx = objList->elements.count - 1;
    while (idx > index) {
        objList->elements.datas[idx] = objList->elements.datas[idx - 1];
        idx--;
    }

    // 插入Value
    objList->elements.datas[index] = value;
}